

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::EitherExpectation::~EitherExpectation(EitherExpectation *this)

{
  Expectation::~Expectation((Expectation *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

explicit EitherExpectation(const Location& loc = Location())
      : ExpectationMixin<ExpectationType::Either>(loc) {}